

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsLoadNonMS::Run(BasicAllTargetsLoadNonMS *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  GLuint GVar10;
  GLint GVar11;
  ostream *poVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  int iVar13;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  GLenum e_06;
  GLenum e_07;
  GLenum e_08;
  GLenum e_09;
  GLenum e_10;
  GLenum e_11;
  GLenum e_12;
  GLenum e_13;
  GLenum e_14;
  GLenum e_15;
  GLenum e_16;
  GLenum e_17;
  GLenum e_18;
  GLenum e_19;
  GLenum e_20;
  GLenum e_21;
  GLenum e_22;
  GLenum e_23;
  GLenum e_24;
  GLenum e_25;
  uint uVar14;
  CallLogWrapper *this_00;
  char *pcVar15;
  GLenum GVar16;
  vec4 *pvVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_528;
  undefined4 local_4fc;
  GLuint textures [7];
  string local_4d8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_498 [2];
  Vector<float,_4> local_478;
  GLchar name [32];
  GLuint buffer;
  GLuint *local_420;
  GLint uniforms;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  value_type local_1b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  
  local_420 = &this->m_vao;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,local_420,&this->m_vbo,(GLuint *)0x0);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = 10.0;
  local_1b8.m_data[2] = -200.0;
  local_1b8.m_data[3] = 3000.0;
  local_478.m_data[0] = -1.0;
  local_478.m_data[1] = 10.0;
  local_478.m_data[2] = -200.0;
  local_478.m_data[3] = 3000.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  poVar12 = std::operator<<((ostream *)&name_index_map,
                            "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_528.first,(void *)0x8814,e);
  poVar12 = std::operator<<(poVar12,(string *)&local_528);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)name,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)name);
  poVar12 = std::operator<<(poVar12,"image1D g_image_1d;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_4d8,(void *)0x8814,e_00);
  poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)textures,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)textures);
  poVar12 = std::operator<<(poVar12,"image2D g_image_2d;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&data,(void *)0x8814,e_01);
  poVar12 = std::operator<<(poVar12,(string *)&data);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)&buffer,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&buffer);
  poVar12 = std::operator<<(poVar12,"image3D g_image_3d;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&uniforms,(void *)0x8814,e_02);
  poVar12 = std::operator<<(poVar12,(string *)&uniforms);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3f8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
  poVar12 = std::operator<<(poVar12,"image2DRect g_image_2drect;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1f8,(void *)0x8814,e_03);
  poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_218,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_218);
  poVar12 = std::operator<<(poVar12,"imageBuffer g_image_buffer;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_238,(void *)0x8814,e_04);
  poVar12 = std::operator<<(poVar12,(string *)&local_238);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_258,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_258);
  poVar12 = std::operator<<(poVar12,"image1DArray g_image_1darray;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_278,(void *)0x8814,e_05);
  poVar12 = std::operator<<(poVar12,(string *)&local_278);
  pcVar15 = ") readonly uniform ";
  poVar12 = std::operator<<(poVar12,") readonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_298,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_298);
  pcVar15 = 
  "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
  ;
  poVar12 = std::operator<<(poVar12,
                            "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2b8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
  pcVar15 = "vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ";
  poVar12 = std::operator<<(poVar12,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2d8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != ";
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2f8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_318,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_318);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_338,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_338);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != ";
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_358,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_358);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != ";
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_378,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_378);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_398,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_398);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3b8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3d8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_3d8);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  pcVar15 = 
  ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
  ;
  poVar12 = std::operator<<(poVar12,
                            ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
                           );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_1d8,pcVar15);
  poVar12 = std::operator<<(poVar12,(string *)&local_1d8);
  poVar12 = std::operator<<(poVar12,"vec4");
  poVar12 = tcu::operator<<(poVar12,&local_478);
  std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&uniforms);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)textures);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)name);
  std::__cxx11::string::~string((string *)&local_528);
  p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  GVar10 = ShaderImageLoadStoreBase::BuildProgram
                     (&this->super_ShaderImageLoadStoreBase,
                      "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                      ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_498[0].m_data._0_8_,
                      (bool *)0x0);
  std::__cxx11::string::~string((string *)local_498);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,7,textures);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x200,&local_1b8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (this_00,0xde0,0,0x8814,0x10,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x806f,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x84f5,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8c2a,0x100,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start),0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[4]);
  glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,buffer);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[5]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8c18,0,0x8814,0x10,2,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[6]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x8c1a,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             (void *)CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[1],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[2],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[4],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,5,textures[5],0,'\x01',0,35000,0x8814);
  pvVar17 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(this_00,6,textures[6],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glUseProgram(this_00,GVar10);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,2);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,3);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,4);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,5);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar11,6);
  glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
  iVar13 = 0x10;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar13,
                     pvVar17);
  local_4fc = (undefined4)CONCAT71(extraout_var,bVar2);
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,&uniforms);
  if (uniforms != 7) {
    local_4fc = 0;
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
  }
  for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < (uint)uniforms; uVar14 = uVar14 + 1) {
    pvVar17 = (vec4 *)name;
    glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,(char *)name,(allocator<char> *)&local_3f8);
    local_528.first._M_string_length = local_4d8._M_string_length;
    local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
      local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
    }
    else {
      local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
    }
    local_528.first.field_2._M_allocated_capacity._1_7_ =
         local_4d8.field_2._M_allocated_capacity._1_7_;
    local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
    local_4d8._M_string_length = 0;
    local_4d8.field_2._M_local_buf[0] = '\0';
    local_528.second = uVar14;
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&name_index_map,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_4d8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_1d",(allocator<char> *)name);
  bVar2 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x904c,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_2d",(allocator<char> *)name);
  bVar3 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x904d,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_3d",(allocator<char> *)name);
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x904e,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_2drect",(allocator<char> *)name);
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x904f,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_buffer",(allocator<char> *)name);
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x9051,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_1darray",(allocator<char> *)name);
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x9052,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"g_image_2darray",(allocator<char> *)name);
  bVar8 = ShaderImageLoadStoreBase::CheckUniform
                    (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map,
                     0x9053,GVar16);
  std::__cxx11::string::~string((string *)&local_528);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
  glu::CallLogWrapper::glDeleteTextures(this_00,7,textures);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
  bVar9 = (byte)local_4fc;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  if ((((bVar5 && bVar6) && bVar7) & (bVar3 && bVar4) & bVar9 & bVar2 & bVar8) == 1) {
    local_1b8.m_data[0] = -NAN;
    local_1b8.m_data[1] = 1.4013e-44;
    local_1b8.m_data[2] = -NAN;
    local_1b8.m_data[3] = 4.2039e-42;
    local_478.m_data[0] = -NAN;
    local_478.m_data[1] = 1.4013e-44;
    local_478.m_data[2] = -NAN;
    local_478.m_data[3] = 4.2039e-42;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
    poVar12 = std::operator<<((ostream *)&name_index_map,
                              "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_528.first,(void *)0x8d82,e_06);
    poVar12 = std::operator<<(poVar12,(string *)&local_528);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              ((string *)name,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)name);
    poVar12 = std::operator<<(poVar12,"image1D g_image_1d;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_4d8,(void *)0x8d82,e_07);
    poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              ((string *)textures,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)textures);
    poVar12 = std::operator<<(poVar12,"image2D g_image_2d;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              ((string *)&data,(void *)0x8d82,e_08);
    poVar12 = std::operator<<(poVar12,(string *)&data);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              ((string *)&buffer,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&buffer);
    poVar12 = std::operator<<(poVar12,"image3D g_image_3d;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              ((string *)&uniforms,(void *)0x8d82,e_09);
    poVar12 = std::operator<<(poVar12,(string *)&uniforms);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_3f8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
    poVar12 = std::operator<<(poVar12,"image2DRect g_image_2drect;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_1f8,(void *)0x8d82,e_10);
    poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_218,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_218);
    poVar12 = std::operator<<(poVar12,"imageBuffer g_image_buffer;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_238,(void *)0x8d82,e_11);
    poVar12 = std::operator<<(poVar12,(string *)&local_238);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_258,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_258);
    poVar12 = std::operator<<(poVar12,"image1DArray g_image_1darray;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_278,(void *)0x8d82,e_12);
    poVar12 = std::operator<<(poVar12,(string *)&local_278);
    pcVar15 = ") readonly uniform ";
    poVar12 = std::operator<<(poVar12,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_298,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_298);
    pcVar15 = 
    "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
    ;
    poVar12 = std::operator<<(poVar12,
                              "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2b8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
    pcVar15 = "vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ";
    poVar12 = std::operator<<(poVar12,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ")
    ;
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2d8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != ";
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2f8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_318,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_318);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_338,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_338);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != ";
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_358,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_358);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_378,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_378);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_398,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_398);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_3b8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_3d8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_3d8);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    pcVar15 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
    ;
    poVar12 = std::operator<<(poVar12,
                              ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
                             );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_1d8,pcVar15);
    poVar12 = std::operator<<(poVar12,(string *)&local_1d8);
    poVar12 = std::operator<<(poVar12,"vec4");
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
    std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&uniforms);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)textures);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)name);
    std::__cxx11::string::~string((string *)&local_528);
    p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
    GVar10 = ShaderImageLoadStoreBase::BuildProgram
                       (&this->super_ShaderImageLoadStoreBase,
                        "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                        ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_498[0].m_data._0_8_,
                        (bool *)0x0);
    std::__cxx11::string::~string((string *)local_498);
    glu::CallLogWrapper::glGenTextures(this_00,7,textures);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
              ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,0x200,
               (value_type *)&local_1b8,(allocator_type *)&name_index_map);
    glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage1D
              (this_00,0xde0,0,0x8d82,0x10,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x806f,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x84f5,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8c2a,0x100,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start),0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[4]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d82,buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x8c18,0,0x8d82,0x10,2,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[6]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
               (void *)CONCAT44(data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[1],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[2],0,'\x01',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[4],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(this_00,5,textures[5],0,'\x01',0,35000,0x8d82);
    pvVar17 = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(this_00,6,textures[6],0,'\x01',0,35000,0x8d82);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,GVar10);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1d");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2d");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_3d");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,2);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2drect");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,3);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,4);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1darray");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,5);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2darray");
    glu::CallLogWrapper::glUniform1i(this_00,GVar11,6);
    glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
    iVar13 = 0x10;
    glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
    bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar13,
                       pvVar17);
    local_4fc = (undefined4)CONCAT71(extraout_var_00,bVar2);
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,&uniforms);
    if (uniforms != 7) {
      local_4fc = 0;
      anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
    }
    for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < (uint)uniforms; uVar14 = uVar14 + 1) {
      pvVar17 = (vec4 *)name;
      glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,(char *)name,(allocator<char> *)&local_3f8);
      local_528.first._M_string_length = local_4d8._M_string_length;
      local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
        local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
      }
      else {
        local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
      }
      local_528.first.field_2._M_allocated_capacity._1_7_ =
           local_4d8.field_2._M_allocated_capacity._1_7_;
      local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
      local_4d8._M_string_length = 0;
      local_4d8.field_2._M_local_buf[0] = '\0';
      local_528.second = uVar14;
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_4d8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_1d",(allocator<char> *)name);
    bVar2 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x9057,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_2d",(allocator<char> *)name);
    bVar3 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x9058,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_3d",(allocator<char> *)name);
    bVar4 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x9059,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_2drect",(allocator<char> *)name);
    bVar5 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x905a,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_buffer",(allocator<char> *)name);
    bVar6 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x905c,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_1darray",(allocator<char> *)name);
    bVar7 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x905d,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"g_image_2darray",(allocator<char> *)name);
    bVar8 = ShaderImageLoadStoreBase::CheckUniform
                      (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,&name_index_map
                       ,0x905e,GVar16);
    std::__cxx11::string::~string((string *)&local_528);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
    glu::CallLogWrapper::glDeleteTextures(this_00,7,textures);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
    bVar9 = (byte)local_4fc;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&name_index_map._M_t);
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data);
    if ((((bVar5 && bVar6) && bVar7) & (bVar3 && bVar4) & bVar9 & bVar2 & bVar8) == 1) {
      local_1b8.m_data[0] = 1.4013e-45;
      local_1b8.m_data[1] = 1.4013e-44;
      local_1b8.m_data[2] = 2.8026e-43;
      local_1b8.m_data[3] = 4.2039e-42;
      local_478.m_data[0] = 1.4013e-45;
      local_478.m_data[1] = 1.4013e-44;
      local_478.m_data[2] = 2.8026e-43;
      local_478.m_data[3] = 4.2039e-42;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
      poVar12 = std::operator<<((ostream *)&name_index_map,
                                "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_528.first,(void *)0x8d70,e_13);
      poVar12 = std::operator<<(poVar12,(string *)&local_528);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>((string *)name,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)name);
      poVar12 = std::operator<<(poVar12,"image1D g_image_1d;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_4d8,(void *)0x8d70,e_14);
      poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)textures);
      poVar12 = std::operator<<(poVar12,"image2D g_image_2d;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)&data,(void *)0x8d70,e_15);
      poVar12 = std::operator<<(poVar12,(string *)&data);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&buffer,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&buffer);
      poVar12 = std::operator<<(poVar12,"image3D g_image_3d;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)&uniforms,(void *)0x8d70,e_16);
      poVar12 = std::operator<<(poVar12,(string *)&uniforms);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3f8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
      poVar12 = std::operator<<(poVar12,"image2DRect g_image_2drect;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_1f8,(void *)0x8d70,e_17);
      poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_218,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_218);
      poVar12 = std::operator<<(poVar12,"imageBuffer g_image_buffer;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_238,(void *)0x8d70,e_18);
      poVar12 = std::operator<<(poVar12,(string *)&local_238);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_258,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_258);
      poVar12 = std::operator<<(poVar12,"image1DArray g_image_1darray;\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_278,(void *)0x8d70,e_19);
      poVar12 = std::operator<<(poVar12,(string *)&local_278);
      pcVar15 = ") readonly uniform ";
      poVar12 = std::operator<<(poVar12,") readonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_298,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_298);
      pcVar15 = 
      "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
      ;
      poVar12 = std::operator<<(poVar12,
                                "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
      pcVar15 = "vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ";
      poVar12 = std::operator<<(poVar12,
                                "vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2d8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != ";
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2f8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_318,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_318);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_338,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_338);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != ";
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_358,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_358);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_378,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_378);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_398,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_398);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3b8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3d8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_3d8);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      pcVar15 = 
      ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
      ;
      poVar12 = std::operator<<(poVar12,
                                ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
                               );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1d8,pcVar15);
      poVar12 = std::operator<<(poVar12,(string *)&local_1d8);
      poVar12 = std::operator<<(poVar12,"vec4");
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
      std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}");
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&uniforms);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::~string((string *)textures);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)name);
      std::__cxx11::string::~string((string *)&local_528);
      p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
      GVar10 = ShaderImageLoadStoreBase::BuildProgram
                         (&this->super_ShaderImageLoadStoreBase,
                          "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                          ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_498[0].m_data._0_8_,
                          (bool *)0x0);
      std::__cxx11::string::~string((string *)local_498);
      glu::CallLogWrapper::glGenTextures(this_00,7,textures);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&data,0x200,(value_type *)&local_1b8,(allocator_type *)&name_index_map);
      glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage1D
                (this_00,0xde0,0,0x8d70,0x10,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (this_00,0xde1,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
      glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage3D
                (this_00,0x806f,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
      glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (this_00,0x84f5,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8c2a,0x100,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start),0x88e8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[4]);
      glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d70,buffer);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[5]);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (this_00,0x8c18,0,0x8d70,0x10,2,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[6]);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage3D
                (this_00,0x8c1a,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
                 (void *)CONCAT44(data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)data.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[1],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[2],0,'\x01',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[4],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(this_00,5,textures[5],0,'\x01',0,35000,0x8d70);
      pvVar17 = (vec4 *)0x0;
      glu::CallLogWrapper::glBindImageTexture(this_00,6,textures[6],0,'\x01',0,35000,0x8d70);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,GVar10);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1d");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,2);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,3);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_buffer");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,4);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,5);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(this_00,GVar11,6);
      glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
      iVar13 = 0x10;
      glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
      bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                        (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar13
                         ,pvVar17);
      local_4fc = (undefined4)CONCAT71(extraout_var_01,bVar2);
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,&uniforms);
      if (uniforms != 7) {
        local_4fc = 0;
        anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
      }
      for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < (uint)uniforms; uVar14 = uVar14 + 1) {
        pvVar17 = (vec4 *)name;
        glu::CallLogWrapper::glGetActiveUniformName(this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d8,(char *)name,(allocator<char> *)&local_3f8);
        local_528.first._M_string_length = local_4d8._M_string_length;
        local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
          local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
        }
        else {
          local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
        }
        local_528.first.field_2._M_allocated_capacity._1_7_ =
             local_4d8.field_2._M_allocated_capacity._1_7_;
        local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
        local_4d8._M_string_length = 0;
        local_4d8.field_2._M_local_buf[0] = '\0';
        local_528.second = uVar14;
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                    *)&name_index_map,&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_4d8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_1d",(allocator<char> *)name);
      bVar2 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9062,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_2d",(allocator<char> *)name);
      bVar3 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9063,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_3d",(allocator<char> *)name);
      bVar4 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9064,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_2drect",(allocator<char> *)name);
      bVar5 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9065,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_buffer",(allocator<char> *)name);
      bVar6 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9067,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_1darray",(allocator<char> *)name);
      bVar7 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9068,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"g_image_2darray",(allocator<char> *)name);
      bVar8 = ShaderImageLoadStoreBase::CheckUniform
                        (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                         &name_index_map,0x9069,GVar16);
      std::__cxx11::string::~string((string *)&local_528);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
      glu::CallLogWrapper::glDeleteTextures(this_00,7,textures);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
      bVar9 = (byte)local_4fc;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree(&name_index_map._M_t);
      std::
      _Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                     *)&data);
      if ((((bVar5 && bVar6) && bVar7) & (bVar3 && bVar4) & bVar9 & bVar2 & bVar8) == 1) {
        local_1d8._M_dataplus._M_p = (pointer)0x41200000bf800000;
        local_1d8._M_string_length = 0x453b8000c3480000;
        local_498[0].m_data[0] = -1.0;
        local_498[0].m_data[1] = 10.0;
        local_498[0].m_data[2] = -200.0;
        local_498[0].m_data[3] = 3000.0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        poVar12 = std::operator<<((ostream *)&name_index_map,
                                  "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_528.first,(void *)0x8814,e_20);
        poVar12 = std::operator<<(poVar12,(string *)&local_528);
        pcVar15 = ") readonly uniform ";
        poVar12 = std::operator<<(poVar12,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)name,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)name);
        poVar12 = std::operator<<(poVar12,"imageCube g_image_cube;\nlayout(");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_4d8,(void *)0x8814,e_21);
        poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
        pcVar15 = ") readonly uniform ";
        poVar12 = std::operator<<(poVar12,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)textures,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)textures);
        pcVar15 = 
        "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
        ;
        poVar12 = std::operator<<(poVar12,
                                  "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)&data,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&data);
        pcVar15 = "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ";
        poVar12 = std::operator<<(poVar12,
                                  "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)&buffer,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&buffer);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)&uniforms,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&uniforms);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_3f8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_1f8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_218,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_218);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_238,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_238);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_258,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_258);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_278,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_278);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_298,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_298);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2b8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2d8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2f8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_318,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_318);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_338,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_338);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_358,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_358);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_378,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_378);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_398,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_398);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        pcVar15 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
        ;
        poVar12 = std::operator<<(poVar12,
                                  ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                                 );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_3b8,pcVar15);
        poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
        poVar12 = std::operator<<(poVar12,"vec4");
        poVar12 = tcu::operator<<(poVar12,local_498);
        std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}");
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&uniforms);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)textures);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)name);
        std::__cxx11::string::~string((string *)&local_528);
        p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        GVar10 = ShaderImageLoadStoreBase::BuildProgram
                           (&this->super_ShaderImageLoadStoreBase,
                            "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                            ,(char *)0x0,(char *)0x0,(char *)0x0,local_3d8._M_dataplus._M_p,
                            (bool *)0x0);
        std::__cxx11::string::~string((string *)&local_3d8);
        glu::CallLogWrapper::glGenTextures(this_00,2,(GLuint *)&data);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   textures,0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
        glu::CallLogWrapper::glBindTexture
                  (this_00,0x8513,
                   (GLuint)data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x8516,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x8515,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x8518,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x8517,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x851a,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glTexImage2D
                  (this_00,0x8519,0,0x8814,0x10,0x10,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
        glu::CallLogWrapper::glBindTexture
                  (this_00,0x9009,
                   data.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_);
        glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2800,0x2600);
        glu::CallLogWrapper::glTexImage3D
                  (this_00,0x9009,0,0x8814,0x10,0x10,0xc,0,0x1908,0x1406,
                   (void *)CONCAT44(textures[1],textures[0]));
        glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,0,
                   (GLuint)data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8814);
        pvVar17 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,1,
                   data.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8814);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,GVar10);
        GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube");
        glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
        GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube_array");
        glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
        glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
        iVar13 = 0x10;
        glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                           iVar13,pvVar17);
        local_4fc = (undefined4)CONCAT71(extraout_var_02,bVar2);
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,(GLint *)&buffer);
        if (buffer != 2) {
          local_4fc = 0;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < buffer; uVar14 = uVar14 + 1) {
          pvVar17 = (vec4 *)name;
          glu::CallLogWrapper::glGetActiveUniformName
                    (this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d8,(char *)name,(allocator<char> *)&uniforms);
          local_528.first._M_string_length = local_4d8._M_string_length;
          local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
            local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
          }
          else {
            local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
          }
          local_528.first.field_2._M_allocated_capacity._1_7_ =
               local_4d8.field_2._M_allocated_capacity._1_7_;
          local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
          local_4d8._M_string_length = 0;
          local_4d8.field_2._M_local_buf[0] = '\0';
          local_528.second = uVar14;
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)&name_index_map,&local_528);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_4d8);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,"g_image_cube",(allocator<char> *)name);
        bVar2 = ShaderImageLoadStoreBase::CheckUniform
                          (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                           &name_index_map,0x9050,GVar16);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,"g_image_cube_array",(allocator<char> *)name);
        bVar3 = ShaderImageLoadStoreBase::CheckUniform
                          (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                           &name_index_map,0x9054,GVar16);
        std::__cxx11::string::~string((string *)&local_528);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
        glu::CallLogWrapper::glDeleteTextures(this_00,2,(GLuint *)&data);
        bVar9 = (byte)local_4fc;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
        ~_Vector_base((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       *)textures);
        if ((bVar9 & bVar2 & bVar3) == 1) {
          local_1d8._M_dataplus._M_p = (pointer)0xaffffffff;
          local_1d8._M_string_length = 0xbb8ffffff38;
          local_498[0].m_data[0] = -NAN;
          local_498[0].m_data[1] = 1.4013e-44;
          local_498[0].m_data[2] = -NAN;
          local_498[0].m_data[3] = 4.2039e-42;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
          poVar12 = std::operator<<((ostream *)&name_index_map,
                                    "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    (&local_528.first,(void *)0x8d82,e_22);
          poVar12 = std::operator<<(poVar12,(string *)&local_528);
          pcVar15 = ") readonly uniform ";
          poVar12 = std::operator<<(poVar12,") readonly uniform ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)name,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)name);
          poVar12 = std::operator<<(poVar12,"imageCube g_image_cube;\nlayout(");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    (&local_4d8,(void *)0x8d82,e_23);
          poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
          pcVar15 = ") readonly uniform ";
          poVar12 = std::operator<<(poVar12,") readonly uniform ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)textures,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)textures);
          pcVar15 = 
          "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
          ;
          poVar12 = std::operator<<(poVar12,
                                    "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)&data,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&data);
          pcVar15 = "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ";
          poVar12 = std::operator<<(poVar12,
                                    "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)&buffer,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&buffer);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)&uniforms,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&uniforms);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_3f8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_1f8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_218,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_218);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_238,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_238);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_258,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_258);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_278,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_278);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_298,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_298);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2b8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2d8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2f8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_318,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_318);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_338,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_338);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_358,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_358);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_378,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_378);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_398,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_398);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          pcVar15 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
          ;
          poVar12 = std::operator<<(poVar12,
                                    ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                                   );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_3b8,pcVar15);
          poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
          poVar12 = std::operator<<(poVar12,"vec4");
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)local_498);
          std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}");
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&uniforms);
          std::__cxx11::string::~string((string *)&buffer);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)textures);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)name);
          std::__cxx11::string::~string((string *)&local_528);
          p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
          GVar10 = ShaderImageLoadStoreBase::BuildProgram
                             (&this->super_ShaderImageLoadStoreBase,
                              "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                              ,(char *)0x0,(char *)0x0,(char *)0x0,local_3d8._M_dataplus._M_p,
                              (bool *)0x0);
          std::__cxx11::string::~string((string *)&local_3d8);
          glu::CallLogWrapper::glGenTextures(this_00,2,(GLuint *)&data);
          std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)textures,
                     0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
          glu::CallLogWrapper::glBindTexture
                    (this_00,0x8513,
                     (GLuint)data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x8516,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x8515,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x8518,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x8517,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x851a,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glTexImage2D
                    (this_00,0x8519,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
          glu::CallLogWrapper::glBindTexture
                    (this_00,0x9009,
                     data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_);
          glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2800,0x2600);
          glu::CallLogWrapper::glTexImage3D
                    (this_00,0x9009,0,0x8d82,0x10,0x10,0xc,0,0x8d99,0x1404,
                     (void *)CONCAT44(textures[1],textures[0]));
          glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
          glu::CallLogWrapper::glBindImageTexture
                    (this_00,0,
                     (GLuint)data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8d82);
          pvVar17 = (vec4 *)0x0;
          glu::CallLogWrapper::glBindImageTexture
                    (this_00,1,
                     data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8d82);
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,GVar10);
          GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube");
          glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
          GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube_array");
          glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
          glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
          iVar13 = 0x10;
          glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
          glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
          name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
          bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                            (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                             iVar13,pvVar17);
          local_4fc = (undefined4)CONCAT71(extraout_var_03,bVar2);
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
               0xffffffff00000000;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,(GLint *)&buffer);
          if (buffer != 2) {
            local_4fc = 0;
            anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
          }
          for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < buffer; uVar14 = uVar14 + 1) {
            pvVar17 = (vec4 *)name;
            glu::CallLogWrapper::glGetActiveUniformName
                      (this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d8,(char *)name,(allocator<char> *)&uniforms);
            local_528.first._M_string_length = local_4d8._M_string_length;
            local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
              local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
            }
            else {
              local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
            }
            local_528.first.field_2._M_allocated_capacity._1_7_ =
                 local_4d8.field_2._M_allocated_capacity._1_7_;
            local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
            local_4d8._M_string_length = 0;
            local_4d8.field_2._M_local_buf[0] = '\0';
            local_528.second = uVar14;
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&name_index_map,&local_528);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::~string((string *)&local_4d8);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_528,"g_image_cube",(allocator<char> *)name);
          bVar2 = ShaderImageLoadStoreBase::CheckUniform
                            (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                             &name_index_map,0x905b,GVar16);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_528,"g_image_cube_array",(allocator<char> *)name);
          bVar3 = ShaderImageLoadStoreBase::CheckUniform
                            (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                             &name_index_map,0x905f,GVar16);
          std::__cxx11::string::~string((string *)&local_528);
          glu::CallLogWrapper::glUseProgram(this_00,0);
          glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
          glu::CallLogWrapper::glDeleteTextures(this_00,2,(GLuint *)&data);
          bVar9 = (byte)local_4fc;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~_Rb_tree(&name_index_map._M_t);
          std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
          ~_Vector_base((_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        textures);
          if ((bVar9 & bVar2 & bVar3) == 1) {
            local_1d8._M_dataplus._M_p = (pointer)0xa00000001;
            local_1d8._M_string_length = 0xbb8000000c8;
            local_498[0].m_data[0] = 1.4013e-45;
            local_498[0].m_data[1] = 1.4013e-44;
            local_498[0].m_data[2] = 2.8026e-43;
            local_498[0].m_data[3] = 4.2039e-42;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
            poVar12 = std::operator<<((ostream *)&name_index_map,
                                      "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                      (&local_528.first,(void *)0x8d70,e_24);
            poVar12 = std::operator<<(poVar12,(string *)&local_528);
            pcVar15 = ") readonly uniform ";
            poVar12 = std::operator<<(poVar12,") readonly uniform ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)name,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)name);
            poVar12 = std::operator<<(poVar12,"imageCube g_image_cube;\nlayout(");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                      (&local_4d8,(void *)0x8d70,e_25);
            poVar12 = std::operator<<(poVar12,(string *)&local_4d8);
            pcVar15 = ") readonly uniform ";
            poVar12 = std::operator<<(poVar12,") readonly uniform ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)textures);
            pcVar15 = 
            "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
            ;
            poVar12 = std::operator<<(poVar12,
                                      "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&data,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&data);
            pcVar15 = "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ";
            poVar12 = std::operator<<(poVar12,
                                      "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&buffer,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&buffer);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&uniforms,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&uniforms);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3f8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_3f8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1f8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_1f8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_218,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_218);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_238,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_238);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_258,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_258);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_278,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_278);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_298,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_298);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_2b8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2d8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_2d8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2f8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_2f8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_318,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_318);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_338,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_338);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_358,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_358);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_378,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_378);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_398,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_398);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            pcVar15 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
            ;
            poVar12 = std::operator<<(poVar12,
                                      ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                                     );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3b8,pcVar15);
            poVar12 = std::operator<<(poVar12,(string *)&local_3b8);
            poVar12 = std::operator<<(poVar12,"vec4");
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)local_498);
            std::operator<<(poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}");
            std::__cxx11::string::~string((string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::__cxx11::string::~string((string *)&uniforms);
            std::__cxx11::string::~string((string *)&buffer);
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)textures);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::__cxx11::string::~string((string *)name);
            std::__cxx11::string::~string((string *)&local_528);
            p_Var1 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
            GVar10 = ShaderImageLoadStoreBase::BuildProgram
                               (&this->super_ShaderImageLoadStoreBase,
                                "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                                ,(char *)0x0,(char *)0x0,(char *)0x0,local_3d8._M_dataplus._M_p,
                                (bool *)0x0);
            std::__cxx11::string::~string((string *)&local_3d8);
            glu::CallLogWrapper::glGenTextures(this_00,2,(GLuint *)&data);
            std::
            vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
            vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    *)textures,0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
            glu::CallLogWrapper::glBindTexture
                      (this_00,0x8513,
                       (GLuint)data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
            glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x8516,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x8515,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x8518,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x8517,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x851a,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glTexImage2D
                      (this_00,0x8519,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
            glu::CallLogWrapper::glBindTexture
                      (this_00,0x9009,
                       data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_);
            glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2600);
            glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2800,0x2600);
            glu::CallLogWrapper::glTexImage3D
                      (this_00,0x9009,0,0x8d70,0x10,0x10,0xc,0,0x8d99,0x1405,
                       (void *)CONCAT44(textures[1],textures[0]));
            glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
            glu::CallLogWrapper::glBindImageTexture
                      (this_00,0,
                       (GLuint)data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8d70);
            pvVar17 = (vec4 *)0x0;
            glu::CallLogWrapper::glBindImageTexture
                      (this_00,1,
                       data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8d70);
            glu::CallLogWrapper::glClear(this_00,0x4000);
            glu::CallLogWrapper::glUseProgram(this_00,GVar10);
            GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube");
            glu::CallLogWrapper::glUniform1i(this_00,GVar11,0);
            GVar11 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar10,"g_image_cube_array");
            glu::CallLogWrapper::glUniform1i(this_00,GVar11,1);
            glu::CallLogWrapper::glBindVertexArray(this_00,*local_420);
            iVar13 = 0x10;
            glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
            bVar2 = ShaderImageLoadStoreBase::ValidateReadBuffer
                              (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                               iVar13,pvVar17);
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
            ;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var1->_M_header;
            local_420._0_4_ = (int)CONCAT71(extraout_var_04,bVar2);
            glu::CallLogWrapper::glGetProgramiv(this_00,GVar10,0x8b86,(GLint *)&buffer);
            if (buffer != 2) {
              local_420._0_4_ = 0;
              anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
            }
            for (uVar14 = 0; GVar16 = (GLenum)pvVar17, uVar14 < buffer; uVar14 = uVar14 + 1) {
              pvVar17 = (vec4 *)name;
              glu::CallLogWrapper::glGetActiveUniformName
                        (this_00,GVar10,uVar14,0x20,(GLsizei *)0x0,name);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d8,(char *)name,(allocator<char> *)&uniforms);
              local_528.first._M_string_length = local_4d8._M_string_length;
              local_528.first._M_dataplus._M_p = (pointer)&local_528.first.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
                local_528.first.field_2._8_8_ = local_4d8.field_2._8_8_;
              }
              else {
                local_528.first._M_dataplus._M_p = local_4d8._M_dataplus._M_p;
              }
              local_528.first.field_2._M_allocated_capacity._1_7_ =
                   local_4d8.field_2._M_allocated_capacity._1_7_;
              local_528.first.field_2._M_local_buf[0] = local_4d8.field_2._M_local_buf[0];
              local_4d8._M_string_length = 0;
              local_4d8.field_2._M_local_buf[0] = '\0';
              local_528.second = uVar14;
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                          *)&name_index_map,&local_528);
              std::__cxx11::string::~string((string *)&local_528);
              std::__cxx11::string::~string((string *)&local_4d8);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_528,"g_image_cube",(allocator<char> *)name);
            bVar2 = ShaderImageLoadStoreBase::CheckUniform
                              (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                               &name_index_map,0x9066,GVar16);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_528,"g_image_cube_array",(allocator<char> *)name);
            bVar3 = ShaderImageLoadStoreBase::CheckUniform
                              (&this->super_ShaderImageLoadStoreBase,GVar10,&local_528.first,
                               &name_index_map,0x906a,GVar16);
            std::__cxx11::string::~string((string *)&local_528);
            glu::CallLogWrapper::glUseProgram(this_00,0);
            glu::CallLogWrapper::glDeleteProgram(this_00,GVar10);
            glu::CallLogWrapper::glDeleteTextures(this_00,2,(GLuint *)&data);
            bVar9 = (byte)local_420._0_4_;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::~_Rb_tree(&name_index_map._M_t);
            std::
            _Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
            ::~_Vector_base((_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)textures);
            return (ulong)(bVar9 & bVar2 & bVar3) - 1;
          }
          return -1;
        }
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!Read(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!Read(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		if (!ReadCube(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!ReadCube(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!ReadCube(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		return NO_ERROR;
	}